

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::ParseTextureChunk(Discreet3DSImporter *this,Texture *pcOut)

{
  StreamReader<false,_false> *this_00;
  char *pcVar1;
  int8_t iVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Logger *pLVar7;
  float fVar8;
  double dVar9;
  uint16_t iFlags;
  allocator local_59;
  string local_58 [36];
  uint local_34;
  int8_t *piStack_30;
  uint cnt;
  char *sz;
  uint oldReadLimit;
  int chunkSize;
  Texture *pTStack_18;
  Chunk chunk;
  Texture *pcOut_local;
  Discreet3DSImporter *this_local;
  
  pTStack_18 = pcOut;
  do {
    do {
      uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar4 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      sz._4_4_ = chunkSize + -6;
    } while (sz._4_4_ < 1);
    this_00 = this->stream;
    iVar5 = StreamReader<false,_false>::GetCurrentPos(this_00);
    sz._0_4_ = StreamReader<false,_false>::SetReadLimit(this_00,iVar5 + sz._4_4_);
    if (oldReadLimit._2_2_ == 0x30) {
      uVar3 = StreamReader<false,_false>::GetI2(this->stream);
      pTStack_18->mTextureBlend = (float)uVar3 / 100.0;
    }
    else if (oldReadLimit._2_2_ == 0x31) {
      fVar8 = StreamReader<false,_false>::GetF4(this->stream);
      pTStack_18->mTextureBlend = fVar8;
    }
    else if (oldReadLimit._2_2_ == 0x32) {
      dVar9 = StreamReader<false,_false>::GetF8(this->stream);
      pTStack_18->mTextureBlend = (float)dVar9;
    }
    else if (oldReadLimit._2_2_ == -0x5d00) {
      piStack_30 = StreamReader<false,_false>::GetPtr(this->stream);
      local_34 = 0;
      while (iVar2 = StreamReader<false,_false>::GetI1(this->stream), pcVar1 = piStack_30,
            iVar2 != '\0') {
        local_34 = local_34 + 1;
      }
      uVar6 = (ulong)local_34;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar1,uVar6,&local_59);
      std::__cxx11::string::operator=((string *)&pTStack_18->mMapName,local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    else if (oldReadLimit._2_2_ == -0x5caf) {
      uVar3 = StreamReader<false,_false>::GetI2(this->stream);
      if ((uVar3 & 2) == 0) {
        if ((uVar3 & 0x10) == 0) {
          pTStack_18->mMapMode = aiTextureMapMode_Wrap;
        }
        else {
          pTStack_18->mMapMode = aiTextureMapMode_Decal;
        }
      }
      else {
        pTStack_18->mMapMode = aiTextureMapMode_Mirror;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5cac) {
      fVar8 = StreamReader<false,_false>::GetF4(this->stream);
      pTStack_18->mScaleU = fVar8;
      if ((pTStack_18->mScaleU == 0.0) && (!NAN(pTStack_18->mScaleU))) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"Texture coordinate scaling in the x direction is zero. Assuming 1.");
        pTStack_18->mScaleU = 1.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5caa) {
      fVar8 = StreamReader<false,_false>::GetF4(this->stream);
      pTStack_18->mScaleV = fVar8;
      if ((pTStack_18->mScaleV == 0.0) && (!NAN(pTStack_18->mScaleV))) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"Texture coordinate scaling in the y direction is zero. Assuming 1.");
        pTStack_18->mScaleV = 1.0;
      }
    }
    else if (oldReadLimit._2_2_ == -0x5ca8) {
      fVar8 = StreamReader<false,_false>::GetF4(this->stream);
      pTStack_18->mOffsetU = -fVar8;
    }
    else if (oldReadLimit._2_2_ == -0x5ca6) {
      fVar8 = StreamReader<false,_false>::GetF4(this->stream);
      pTStack_18->mOffsetV = fVar8;
    }
    else if (oldReadLimit._2_2_ == -0x5ca4) {
      fVar8 = StreamReader<false,_false>::GetF4(this->stream);
      pTStack_18->mRotation = -(fVar8 * 0.017453292);
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,(uint)sz);
    uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar4 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseTextureChunk(D3DS::Texture* pcOut)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_MAPFILE:
        {
        // The material name string is already zero-terminated, but we need to be sure ...
        const char* sz = (const char*)stream->GetPtr();
        unsigned int cnt = 0;
        while (stream->GetI1())
            ++cnt;
        pcOut->mMapName = std::string(sz,cnt);
        }
        break;


    case Discreet3DS::CHUNK_PERCENTD:
        // Manually parse the blend factor
        pcOut->mTextureBlend = ai_real( stream->GetF8() );
        break;

    case Discreet3DS::CHUNK_PERCENTF:
        // Manually parse the blend factor
        pcOut->mTextureBlend = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_PERCENTW:
        // Manually parse the blend factor
        pcOut->mTextureBlend = (ai_real)((uint16_t)stream->GetI2()) / ai_real( 100.0 );
        break;

    case Discreet3DS::CHUNK_MAT_MAP_USCALE:
        // Texture coordinate scaling in the U direction
        pcOut->mScaleU = stream->GetF4();
        if (0.0f == pcOut->mScaleU)
        {
            ASSIMP_LOG_WARN("Texture coordinate scaling in the x direction is zero. Assuming 1.");
            pcOut->mScaleU = 1.0f;
        }
        break;
    case Discreet3DS::CHUNK_MAT_MAP_VSCALE:
        // Texture coordinate scaling in the V direction
        pcOut->mScaleV = stream->GetF4();
        if (0.0f == pcOut->mScaleV)
        {
            ASSIMP_LOG_WARN("Texture coordinate scaling in the y direction is zero. Assuming 1.");
            pcOut->mScaleV = 1.0f;
        }
        break;

    case Discreet3DS::CHUNK_MAT_MAP_UOFFSET:
        // Texture coordinate offset in the U direction
        pcOut->mOffsetU = -stream->GetF4();
        break;

    case Discreet3DS::CHUNK_MAT_MAP_VOFFSET:
        // Texture coordinate offset in the V direction
        pcOut->mOffsetV = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_MAT_MAP_ANG:
        // Texture coordinate rotation, CCW in DEGREES
        pcOut->mRotation = -AI_DEG_TO_RAD( stream->GetF4() );
        break;

    case Discreet3DS::CHUNK_MAT_MAP_TILING:
        {
        const uint16_t iFlags = stream->GetI2();

        // Get the mapping mode (for both axes)
        if (iFlags & 0x2u)
            pcOut->mMapMode = aiTextureMapMode_Mirror;

        else if (iFlags & 0x10u)
            pcOut->mMapMode = aiTextureMapMode_Decal;

        // wrapping in all remaining cases
        else pcOut->mMapMode = aiTextureMapMode_Wrap;
        }
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}